

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall
amrex::AmrLevel::checkPoint(AmrLevel *this,string *dir,ostream *os,How how,bool dump_old)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  int num;
  string PathNameInHdr;
  string FullPathName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string FullPath;
  string LevelDir;
  string local_e0;
  How local_bc;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_bc = how;
  uVar2 = DescriptorList::size((DescriptorList *)desc_lst);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  LevelDirectoryNames(this,dir,&local_58,&local_78);
  if (this->levelDirectoryCreated == false) {
    (*this->_vptr_AmrLevel[2])(this,dir);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"AmrLevel::checkPoint::dir","");
    ParallelDescriptor::Barrier(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    poVar3 = (ostream *)std::ostream::operator<<(os,this->level);
    local_e0._M_dataplus._M_p._0_1_ = 10;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_e0,1);
    poVar3 = amrex::operator<<(poVar3,&this->geom);
    local_e0._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_e0,1);
    BoxArray::writeOn(&this->grids,os);
    poVar3 = (ostream *)std::ostream::operator<<(os,uVar2);
    local_e0._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_e0,1);
  }
  if (0 < (int)uVar2) {
    paVar1 = &local_b8.field_2;
    local_38 = (ulong)uVar2 * 0xe0;
    lVar4 = 0;
    num = 0;
    do {
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_58._M_dataplus._M_p,
                 local_58._M_dataplus._M_p + local_58._M_string_length);
      std::__cxx11::string::append((char *)&local_b8);
      Concatenate(&local_e0,&local_b8,num,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      std::__cxx11::string::append((char *)&local_98);
      Concatenate(&local_b8,&local_98,num,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      StateData::checkPoint
                ((StateData *)
                 ((long)(((this->state).
                          super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                          super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                          _M_impl.super__Vector_impl_data._M_start)->domain).smallend.vect +
                 lVar4 + -0x10),&local_e0,&local_b8,os,local_bc,dump_old);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      num = num + 1;
      lVar4 = lVar4 + 0xe0;
    } while (local_38 != lVar4);
  }
  this->levelDirectoryCreated = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
AmrLevel::checkPoint (const std::string& dir,
                      std::ostream&      os,
                      VisMF::How         how,
                      bool               dump_old)
{
    BL_PROFILE("AmrLevel::checkPoint()");
    int ndesc = desc_lst.size(), i;
    //
    // Build directory to hold the MultiFabs in the StateData at this level.
    // The directory is relative the the directory containing the Header file.
    //
    std::string LevelDir, FullPath;
    LevelDirectoryNames(dir, LevelDir, FullPath);
    if( ! levelDirectoryCreated) {
      CreateLevelDirectory(dir);
      // ---- Force other processors to wait until directory is built.
      ParallelDescriptor::Barrier("AmrLevel::checkPoint::dir");
    }

    if (ParallelDescriptor::IOProcessor())
    {
        os << level << '\n' << geom  << '\n';
        grids.writeOn(os);
        os << ndesc << '\n';
    }
    //
    // Output state data.
    //

    for (i = 0; i < ndesc; i++)
    {
        //
        // Now build the full relative pathname of the StateData.
        // The name is relative to the Header file containing this name.
        // It's the name that gets written into the Header.
        //
        std::string PathNameInHdr = amrex::Concatenate(LevelDir + "/SD_", i, 1);
        std::string FullPathName  = amrex::Concatenate(FullPath + "/SD_", i, 1);

        state[i].checkPoint(PathNameInHdr, FullPathName, os, how, dump_old);
    }

    levelDirectoryCreated = false;  // ---- now that the checkpoint is finished
}